

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void duckdb::MallocTrim(idx_t pad)

{
  atomic<long> aVar1;
  bool bVar2;
  timestamp_t input;
  undefined1 auVar3 [16];
  timestamp_ms_t result;
  __atomic_base<long> local_48;
  string local_40;
  
  aVar1.super___atomic_base<long>._M_i =
       MallocTrim::LAST_TRIM_TIMESTAMP_MS.super___atomic_base<long>._M_i;
  input = Timestamp::GetCurrentTimestamp();
  bVar2 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_ms_t>
                    (input,(timestamp_ms_t *)&local_48,false);
  if (!bVar2) {
    auVar3 = __cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_ms_t>
              (&local_40,(duckdb *)input.value,(timestamp_t)auVar3._8_8_);
    InvalidInputException::InvalidInputException(auVar3._0_8_,&local_40);
    __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (99 < local_48._M_i - (long)aVar1.super___atomic_base<long>._M_i) {
    LOCK();
    bVar2 = aVar1.super___atomic_base<long>._M_i ==
            MallocTrim::LAST_TRIM_TIMESTAMP_MS.super___atomic_base<long>._M_i;
    if (bVar2) {
      MallocTrim::LAST_TRIM_TIMESTAMP_MS.super___atomic_base<long>._M_i =
           (__atomic_base<long>)(__atomic_base<long>)local_48._M_i;
    }
    UNLOCK();
    if (bVar2) {
      malloc_trim(pad);
    }
  }
  return;
}

Assistant:

static void MallocTrim(idx_t pad) {
#ifdef __GLIBC__
	static constexpr int64_t TRIM_INTERVAL_MS = 100;
	static atomic<int64_t> LAST_TRIM_TIMESTAMP_MS {0};

	int64_t last_trim_timestamp_ms = LAST_TRIM_TIMESTAMP_MS.load();
	auto current_ts = Timestamp::GetCurrentTimestamp();
	auto current_timestamp_ms = Cast::Operation<timestamp_t, timestamp_ms_t>(current_ts).value;

	if (current_timestamp_ms - last_trim_timestamp_ms < TRIM_INTERVAL_MS) {
		return; // We trimmed less than TRIM_INTERVAL_MS ago
	}
	if (!LAST_TRIM_TIMESTAMP_MS.compare_exchange_strong(last_trim_timestamp_ms, current_timestamp_ms,
	                                                    std::memory_order_acquire, std::memory_order_relaxed)) {
		return; // Another thread has updated LAST_TRIM_TIMESTAMP_MS since we loaded it
	}

	// We succesfully updated LAST_TRIM_TIMESTAMP_MS, we can trim
	malloc_trim(pad);
#endif
}